

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

void rgbcx::encode_bc1_solid_block(void *pDst,uint32_t fr,uint32_t fg,uint32_t fb,bool allow_3color)

{
  uint8_t uVar1;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  bc1_block *in_RDI;
  byte in_R8B;
  uint32_t err3;
  uint32_t err4;
  int min16;
  int max16;
  uint32_t mask;
  bc1_block *pDst_block;
  uint local_2c;
  uint local_28;
  uint local_24;
  bc1_block *local_20;
  byte local_15;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_15 = in_R8B & 1;
  local_24 = 0xaa;
  local_28 = 0xffffffff;
  local_2c = 0;
  local_20 = in_RDI;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((local_15 != 0) &&
     ((uint)(byte)g_bc1_match5_half[(ulong)in_ESI * 3 + 2] +
      (uint)(byte)g_bc1_match6_half[(ulong)in_EDX * 3 + 2] +
      (uint)(byte)g_bc1_match5_half[(ulong)in_ECX * 3 + 2] <
      (uint)(byte)g_bc1_match5_equals_1[(ulong)in_ESI * 3 + 2] +
      (uint)(byte)g_bc1_match6_equals_1[(ulong)in_EDX * 3 + 2] +
      (uint)(byte)g_bc1_match5_equals_1[(ulong)in_ECX * 3 + 2])) {
    local_28 = (uint)(byte)g_bc1_match5_half[(ulong)in_ESI * 3] << 0xb |
               (uint)(byte)g_bc1_match6_half[(ulong)in_EDX * 3] << 5 |
               (uint)(byte)g_bc1_match5_half[(ulong)in_ECX * 3];
    local_2c = (uint)(byte)g_bc1_match5_half[(ulong)in_ESI * 3 + 1] << 0xb |
               (uint)(byte)g_bc1_match6_half[(ulong)in_EDX * 3 + 1] << 5 |
               (uint)(byte)g_bc1_match5_half[(ulong)in_ECX * 3 + 1];
    if (local_2c < local_28) {
      std::swap<int>((int *)&local_28,(int *)&local_2c);
    }
  }
  if (local_28 == 0xffffffff) {
    local_28 = (uint)(byte)g_bc1_match5_equals_1[(ulong)local_c * 3] << 0xb |
               (uint)(byte)g_bc1_match6_equals_1[(ulong)local_10 * 3] << 5 |
               (uint)(byte)g_bc1_match5_equals_1[(ulong)local_14 * 3];
    local_2c = (uint)(byte)g_bc1_match5_equals_1[(ulong)local_c * 3 + 1] << 0xb |
               (uint)(byte)g_bc1_match6_equals_1[(ulong)local_10 * 3 + 1] << 5 |
               (uint)(byte)g_bc1_match5_equals_1[(ulong)local_14 * 3 + 1];
    if (local_2c == local_28) {
      local_24 = 0;
      if (local_2c == 0) {
        local_28 = 1;
        local_2c = 0;
        local_24 = 0x55;
      }
      else {
        local_2c = local_2c - 1;
      }
    }
    if ((int)local_28 < (int)local_2c) {
      std::swap<int>((int *)&local_28,(int *)&local_2c);
      local_24 = local_24 ^ 0x55;
    }
  }
  bc1_block::set_low_color(local_20,(uint16_t)local_28);
  bc1_block::set_high_color(local_20,(uint16_t)local_2c);
  uVar1 = (uint8_t)local_24;
  local_20->m_selectors[0] = uVar1;
  local_20->m_selectors[1] = uVar1;
  local_20->m_selectors[2] = uVar1;
  local_20->m_selectors[3] = uVar1;
  return;
}

Assistant:

void encode_bc1_solid_block(void* pDst, uint32_t fr, uint32_t fg, uint32_t fb, bool allow_3color) 
	{
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);

		uint32_t mask = 0xAA;
		int max16 = -1, min16 = 0;

		if (allow_3color)
		{
			const uint32_t err4 = g_bc1_match5_equals_1[fr].m_e + g_bc1_match6_equals_1[fg].m_e + g_bc1_match5_equals_1[fb].m_e;
			const uint32_t err3 = g_bc1_match5_half[fr].m_e + g_bc1_match6_half[fg].m_e + g_bc1_match5_half[fb].m_e;

			if (err3 < err4)
			{
				max16 = (g_bc1_match5_half[fr].m_hi << 11) | (g_bc1_match6_half[fg].m_hi << 5) | g_bc1_match5_half[fb].m_hi;
				min16 = (g_bc1_match5_half[fr].m_lo << 11) | (g_bc1_match6_half[fg].m_lo << 5) | g_bc1_match5_half[fb].m_lo;

				if (max16 > min16)
					std::swap(max16, min16);
			}
		}

		if (max16 == -1)
		{
			max16 = (g_bc1_match5_equals_1[fr].m_hi << 11) | (g_bc1_match6_equals_1[fg].m_hi << 5) | g_bc1_match5_equals_1[fb].m_hi;
			min16 = (g_bc1_match5_equals_1[fr].m_lo << 11) | (g_bc1_match6_equals_1[fg].m_lo << 5) | g_bc1_match5_equals_1[fb].m_lo;

			if (min16 == max16)
			{
				// Always forbid 3 color blocks
				// This is to guarantee that BC3 blocks never use punchthrough alpha (3 color) mode, which isn't supported on some (all?) GPU's.
				mask = 0;

				// Make l > h
				if (min16 > 0)
					min16--;
				else
				{
					// l = h = 0
					assert(min16 == max16 && max16 == 0);

					max16 = 1;
					min16 = 0;
					mask = 0x55;
				}

				assert(max16 > min16);
			}

			if (max16 < min16)
			{
				std::swap(max16, min16);
				mask ^= 0x55;
			}
		}

		pDst_block->set_low_color(static_cast<uint16_t>(max16));
		pDst_block->set_high_color(static_cast<uint16_t>(min16));
		pDst_block->m_selectors[0] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[1] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[2] = static_cast<uint8_t>(mask);
		pDst_block->m_selectors[3] = static_cast<uint8_t>(mask);
	}